

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledInputFile.cpp
# Opt level: O0

void __thiscall Imf_3_2::anon_unknown_5::TileBufferTask::execute(TileBufferTask *this)

{
  int iVar1;
  char **ppcVar2;
  char *pcVar3;
  reference pvVar4;
  char *endPtr_00;
  char **in_RDI;
  exception *e;
  int compSize;
  char *compPtr;
  char *endPtr;
  char *readPtr;
  intptr_t base;
  int yOffset;
  int xOffset;
  TOutSliceInfo *slice;
  uint i;
  int y;
  int numPixelsPerScanLine;
  int numScanLines;
  Box2i tileRange;
  char *writePtr;
  undefined4 uVar5;
  undefined4 in_stack_fffffffffffffeec;
  undefined4 uVar6;
  undefined4 in_stack_fffffffffffffef4;
  long *plVar7;
  Array<char> *tileBuffer;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 uVar8;
  undefined8 in_stack_ffffffffffffff40;
  size_t in_stack_ffffffffffffff48;
  char **writePtr_00;
  TileDescription *in_stack_ffffffffffffff68;
  size_t in_stack_ffffffffffffff70;
  PixelType in_stack_ffffffffffffff78;
  Format in_stack_ffffffffffffff7c;
  int in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  int in_stack_ffffffffffffff88;
  undefined4 uStack_74;
  int in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff98;
  uint local_44;
  int local_40;
  int local_30;
  int local_28;
  
  ppcVar2 = (char **)Array::operator_cast_to_char_((Array *)in_RDI[3]);
  uVar5 = *(undefined4 *)(in_RDI[3] + 0x28);
  uVar6 = *(undefined4 *)(in_RDI[3] + 0x2c);
  writePtr_00 = ppcVar2;
  Imf_3_2::dataWindowForTile
            (in_stack_ffffffffffffff68,(int)((ulong)ppcVar2 >> 0x20),(int)ppcVar2,
             (int)((ulong)in_RDI >> 0x20),(int)in_RDI,in_stack_ffffffffffffff80,
             in_stack_ffffffffffffff88,in_stack_ffffffffffffff90,in_stack_ffffffffffffff98);
  for (local_40 = local_30; local_40 <= local_28; local_40 = local_40 + 1) {
    local_44 = 0;
    while( true ) {
      endPtr_00 = (char *)(ulong)local_44;
      pcVar3 = (char *)std::
                       vector<Imf_3_2::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_3_2::(anonymous_namespace)::TOutSliceInfo>_>
                       ::size((vector<Imf_3_2::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_3_2::(anonymous_namespace)::TOutSliceInfo>_>
                               *)(in_RDI[2] + 0xe8));
      if (pcVar3 <= endPtr_00) break;
      pvVar4 = std::
               vector<Imf_3_2::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_3_2::(anonymous_namespace)::TOutSliceInfo>_>
               ::operator[]((vector<Imf_3_2::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_3_2::(anonymous_namespace)::TOutSliceInfo>_>
                             *)(in_RDI[2] + 0xe8),(ulong)local_44);
      if ((pvVar4->zero & 1U) == 0) {
        copyFromFrameBuffer(writePtr_00,in_RDI,endPtr_00,in_stack_ffffffffffffff48,
                            (Format)((ulong)in_stack_ffffffffffffff40 >> 0x20),
                            (PixelType)in_stack_ffffffffffffff40);
      }
      else {
        fillChannelWithZeroes
                  ((char **)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                   in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
      }
      local_44 = local_44 + 1;
    }
  }
  pcVar3 = Array::operator_cast_to_char_((Array *)in_RDI[3]);
  *(int *)(in_RDI[3] + 0x18) = (int)ppcVar2 - (int)pcVar3;
  pcVar3 = Array::operator_cast_to_char_((Array *)in_RDI[3]);
  *(char **)(in_RDI[3] + 0x10) = pcVar3;
  if (*(long *)(in_RDI[3] + 0x20) != 0) {
    pcVar3 = in_RDI[3];
    plVar7 = *(long **)(pcVar3 + 0x20);
    tileBuffer = *(Array<char> **)(pcVar3 + 0x10);
    uVar8 = *(undefined4 *)(pcVar3 + 0x18);
    Imath_3_2::Box<Imath_3_2::Vec2<int>_>::Box
              ((Box<Imath_3_2::Vec2<int>_> *)CONCAT44(in_stack_fffffffffffffef4,uVar6),
               (Box<Imath_3_2::Vec2<int>_> *)CONCAT44(in_stack_fffffffffffffeec,uVar5));
    iVar1 = (**(code **)(*plVar7 + 0x28))
                      (plVar7,tileBuffer,uVar8,&stack0xffffffffffffff74,&stack0xffffffffffffff88);
    if (iVar1 < *(int *)(in_RDI[3] + 0x18)) {
      *(int *)(in_RDI[3] + 0x18) = iVar1;
      *(ulong *)(in_RDI[3] + 0x10) = CONCAT44(uStack_74,in_stack_ffffffffffffff88);
    }
    else if (*(int *)(in_RDI[2] + 0xe0) == 0) {
      convertToXdr((Data *)CONCAT44(uVar8,in_stack_ffffffffffffff20),tileBuffer,
                   (int)((ulong)plVar7 >> 0x20),(int)plVar7);
    }
  }
  return;
}

Assistant:

void
TileBufferTask::execute ()
{
    try
    {
        //
        // Calculate information about the tile
        //

        Box2i tileRange = OPENEXR_IMF_INTERNAL_NAMESPACE::dataWindowForTile (
            _ifd->tileDesc,
            _ifd->minX,
            _ifd->maxX,
            _ifd->minY,
            _ifd->maxY,
            _tileBuffer->dx,
            _tileBuffer->dy,
            _tileBuffer->lx,
            _tileBuffer->ly);

        //
        // Get the size of the tile.
        //

        Array<unsigned int> numPixelsPerScanLine;
        numPixelsPerScanLine.resizeErase (
            tileRange.max.y - tileRange.min.y + 1);

        int sizeOfTile          = 0;
        int maxBytesPerTileLine = 0;

        for (int y = tileRange.min.y; y <= tileRange.max.y; y++)
        {
            numPixelsPerScanLine[y - tileRange.min.y] = 0;

            int bytesPerLine = 0;

            for (int x = tileRange.min.x; x <= tileRange.max.x; x++)
            {
                int xOffset = _ifd->sampleCountXTileCoords * tileRange.min.x;
                int yOffset = _ifd->sampleCountYTileCoords * tileRange.min.y;

                int count = _ifd->getSampleCount (x - xOffset, y - yOffset);
                for (unsigned int c = 0; c < _ifd->slices.size (); ++c)
                {
                    // This slice does not exist in the file.
                    if (!_ifd->slices[c]->fill)
                    {
                        sizeOfTile +=
                            count * pixelTypeSize (_ifd->slices[c]->typeInFile);
                        bytesPerLine +=
                            count * pixelTypeSize (_ifd->slices[c]->typeInFile);
                    }
                }
                numPixelsPerScanLine[y - tileRange.min.y] += count;
            }

            if (bytesPerLine > maxBytesPerTileLine)
                maxBytesPerTileLine = bytesPerLine;
        }

        // (TODO) don't do this every time.
        if (_tileBuffer->compressor != 0) delete _tileBuffer->compressor;
        _tileBuffer->compressor = newTileCompressor (
            _ifd->header.compression (),
            maxBytesPerTileLine,
            _ifd->tileDesc.ySize,
            _ifd->header);

        //
        // Uncompress the data, if necessary
        //

        if (_tileBuffer->compressor &&
            _tileBuffer->dataSize < static_cast<uint64_t> (sizeOfTile))
        {
            _tileBuffer->format = _tileBuffer->compressor->format ();

            _tileBuffer->dataSize = _tileBuffer->compressor->uncompressTile (
                _tileBuffer->buffer,
                static_cast<int> (_tileBuffer->dataSize),
                tileRange,
                _tileBuffer->uncompressedData);
        }
        else
        {
            //
            // If the line is uncompressed, it's in XDR format,
            // regardless of the compressor's output format.
            //

            _tileBuffer->format           = Compressor::XDR;
            _tileBuffer->uncompressedData = _tileBuffer->buffer;
        }

        //
        // sanity check data size: the uncompressed data should be exactly
        // 'sizeOfTile' (if it's less, the file is corrupt and there'll be a buffer overrun)
        //
        if (_tileBuffer->dataSize != static_cast<uint64_t> (sizeOfTile))
        {
            THROW (
                IEX_NAMESPACE::InputExc,
                "size mismatch when reading deep tile: expected "
                    << sizeOfTile << "bytes of uncompressed data but got "
                    << _tileBuffer->dataSize);
        }

        //
        // Convert the tile of pixel data back from the machine-independent
        // representation, and store the result in the frame buffer.
        //

        const char* readPtr = _tileBuffer->uncompressedData;
        // points to where we
        // read from in the
        // tile block

        //
        // Iterate over the scan lines in the tile.
        //

        for (int y = tileRange.min.y; y <= tileRange.max.y; ++y)
        {
            //
            // Iterate over all image channels.
            //

            for (unsigned int i = 0; i < _ifd->slices.size (); ++i)
            {
                TInSliceInfo& slice = *_ifd->slices[i];

                //
                // These offsets are used to facilitate both
                // absolute and tile-relative pixel coordinates.
                //

                int xOffsetForData = (slice.xTileCoords == 0) ? 0
                                                              : tileRange.min.x;
                int yOffsetForData = (slice.yTileCoords == 0) ? 0
                                                              : tileRange.min.y;
                int xOffsetForSampleCount =
                    (_ifd->sampleCountXTileCoords == 0) ? 0 : tileRange.min.x;
                int yOffsetForSampleCount =
                    (_ifd->sampleCountYTileCoords == 0) ? 0 : tileRange.min.y;

                //
                // Fill the frame buffer with pixel data.
                //

                if (slice.skip)
                {
                    //
                    // The file contains data for this channel, but
                    // the frame buffer contains no slice for this channel.
                    //

                    skipChannel (
                        readPtr,
                        slice.typeInFile,
                        numPixelsPerScanLine[y - tileRange.min.y]);
                }
                else
                {
                    //
                    // The frame buffer contains a slice for this channel.
                    //

                    copyIntoDeepFrameBuffer (
                        readPtr,
                        slice.pointerArrayBase,
                        _ifd->sampleCountSliceBase,
                        _ifd->sampleCountXStride,
                        _ifd->sampleCountYStride,
                        y,
                        tileRange.min.x,
                        tileRange.max.x,
                        xOffsetForSampleCount,
                        yOffsetForSampleCount,
                        xOffsetForData,
                        yOffsetForData,
                        slice.sampleStride,
                        slice.xStride,
                        slice.yStride,
                        slice.fill,
                        slice.fillValue,
                        _tileBuffer->format,
                        slice.typeInFrameBuffer,
                        slice.typeInFile);
                }
            }
        }
    }
    catch (std::exception& e)
    {
        if (!_tileBuffer->hasException)
        {
            _tileBuffer->exception    = e.what ();
            _tileBuffer->hasException = true;
        }
    }
    catch (...)
    {
        if (!_tileBuffer->hasException)
        {
            _tileBuffer->exception    = "unrecognized exception";
            _tileBuffer->hasException = true;
        }
    }
}